

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

bool fmt::v8::detail::check_char_specs<char,fmt::v8::detail::error_handler>
               (basic_format_specs<char> *specs,error_handler *eh)

{
  error_handler *in_RSI;
  long in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if ((*(char *)(in_RDI + 8) == '\0') || (*(char *)(in_RDI + 8) == 'c')) {
    if (((*(ushort *)(in_RDI + 9) & 0xf) == 4) ||
       (((*(ushort *)(in_RDI + 9) >> 4 & 7) != 0 || ((*(ushort *)(in_RDI + 9) >> 7 & 1) != 0)))) {
      error_handler::on_error
                (eh,(char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    }
    bVar1 = true;
  }
  else {
    check_int_type_spec<fmt::v8::detail::error_handler&>((char)((ulong)in_RDI >> 0x38),in_RSI);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

FMT_CONSTEXPR auto check_char_specs(const basic_format_specs<Char>& specs,
                                    ErrorHandler&& eh = {}) -> bool {
  if (specs.type && specs.type != 'c') {
    check_int_type_spec(specs.type, eh);
    return false;
  }
  if (specs.align == align::numeric || specs.sign != sign::none || specs.alt)
    eh.on_error("invalid format specifier for char");
  return true;
}